

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<false> *handler,bool isKey)

{
  Ch CVar1;
  bool bVar2;
  Ch *begin;
  byte in_CL;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  Ch *str;
  size_t length;
  Ch *head;
  bool success;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  size_t offset;
  uint codepoint2;
  uint codepoint;
  Ch e;
  size_t escapeOffset;
  Ch c;
  ParseErrorCode in_stack_fffffffffffffecc;
  undefined4 uVar3;
  ParseErrorCode code;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffed0;
  SizeType len;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee1;
  undefined1 in_stack_fffffffffffffee2;
  undefined1 in_stack_fffffffffffffee3;
  uint in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffee9;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  uint in_stack_fffffffffffffeec;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_c8;
  size_t local_88;
  uint local_7c;
  uint local_78;
  byte local_71;
  size_t local_70;
  byte local_61;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_60;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_58;
  char local_41;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_40;
  undefined1 local_32;
  char local_31;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_30;
  undefined1 local_21;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_20;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_18;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_10;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_8;
  
  local_c8.stack_.stackEnd_._7_1_ = in_CL & 1;
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy((StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
                   *)&local_c8,in_RSI);
  GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
            ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&local_c8);
  begin = GenericInsituStringStream<rapidjson::UTF8<char>_>::PutBegin
                    ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&local_c8);
  local_60 = &local_c8;
  local_58 = &local_c8;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          local_18 = local_58;
          local_20 = local_60;
          local_61 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek
                               ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
          if (local_61 == 0x5c) break;
          if (local_61 == 0x22) {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                      ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Put
                      ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_60,'\0');
            goto LAB_002b6abf;
          }
          if (local_61 < 0x20) {
            if (local_61 == 0) {
              GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell
                        ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,0x2b69b5);
              in_stack_fffffffffffffedf =
                   GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x2b69bf);
              if ((bool)in_stack_fffffffffffffedf) goto LAB_002b6abf;
            }
            else {
              GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell
                        ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,0x2b69f5);
              in_stack_fffffffffffffede =
                   GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x2b69ff);
              if ((bool)in_stack_fffffffffffffede) goto LAB_002b6abf;
            }
          }
          else {
            local_88 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell
                                 ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
            local_8 = local_58;
            local_10 = local_60;
            in_stack_fffffffffffffed0 = local_60;
            CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                              ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Put
                      ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                       in_stack_fffffffffffffed0,CVar1);
          }
        }
        local_70 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell
                             ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                  ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
        local_71 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek
                             ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
        if (ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
            ::escape[local_71] == '\0') break;
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                  ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Put
                  ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_60,
                   ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
                   ::escape[local_71]);
      }
      if (local_71 != 0x75) break;
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
      in_stack_fffffffffffffeec =
           ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                     ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)CONCAT44(in_stack_fffffffffffffeec,
                                  CONCAT13(in_stack_fffffffffffffeeb,
                                           CONCAT12(in_stack_fffffffffffffeea,
                                                    CONCAT11(in_stack_fffffffffffffee9,
                                                             in_stack_fffffffffffffee8)))),
                      (GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                      CONCAT44(in_stack_fffffffffffffee4,
                               CONCAT13(in_stack_fffffffffffffee3,
                                        CONCAT12(in_stack_fffffffffffffee2,
                                                 CONCAT11(in_stack_fffffffffffffee1,
                                                          in_stack_fffffffffffffee0)))),
                      CONCAT17(in_stack_fffffffffffffedf,
                               CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
      local_78 = in_stack_fffffffffffffeec;
      in_stack_fffffffffffffeeb =
           GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
           HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          *)0x2b66b1);
      if ((bool)in_stack_fffffffffffffeeb) goto LAB_002b6abf;
      in_stack_fffffffffffffeea = 0xd7ff < local_78 && local_78 < 0xdc00;
      if ((bool)in_stack_fffffffffffffeea) {
        local_30 = local_58;
        local_31 = '\\';
        CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek
                          ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
        bVar2 = CVar1 == local_31;
        if (bVar2) {
          GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                    ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_30);
        }
        in_stack_fffffffffffffee9 = 1;
        local_21 = bVar2;
        if (bVar2) {
          local_40 = local_58;
          local_41 = 'u';
          CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek
                            ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_58);
          bVar2 = CVar1 == local_41;
          if (bVar2) {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
                      ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)local_40);
          }
          in_stack_fffffffffffffee9 = bVar2 ^ 0xff;
          local_32 = bVar2;
        }
        if ((in_stack_fffffffffffffee9 & 1) != 0) {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,0x2b67ec);
          in_stack_fffffffffffffee8 =
               GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
               ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                *)0x2b67f6);
          if ((bool)in_stack_fffffffffffffee8) goto LAB_002b6abf;
        }
        in_stack_fffffffffffffee4 =
             ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                       ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)CONCAT44(in_stack_fffffffffffffeec,
                                    CONCAT13(in_stack_fffffffffffffeeb,
                                             CONCAT12(in_stack_fffffffffffffeea,
                                                      CONCAT11(in_stack_fffffffffffffee9,
                                                               in_stack_fffffffffffffee8)))),
                        (GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,
                                 CONCAT13(in_stack_fffffffffffffee3,
                                          CONCAT12(in_stack_fffffffffffffee2,
                                                   CONCAT11(in_stack_fffffffffffffee1,
                                                            in_stack_fffffffffffffee0)))),
                        CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
        local_7c = in_stack_fffffffffffffee4;
        in_stack_fffffffffffffee3 =
             GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            *)0x2b6842);
        if ((bool)in_stack_fffffffffffffee3) goto LAB_002b6abf;
        in_stack_fffffffffffffee2 = local_7c < 0xdc00 || 0xdfff < local_7c;
        if ((bool)in_stack_fffffffffffffee2) {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,0x2b689d);
          in_stack_fffffffffffffee1 =
               GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
               ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                *)0x2b68a7);
          if ((bool)in_stack_fffffffffffffee1) goto LAB_002b6abf;
        }
        local_78 = ((local_78 - 0xd800) * 0x400 | local_7c - 0xdc00) + 0x10000;
      }
      UTF8<char>::Encode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffecc);
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,0x2b6915);
    in_stack_fffffffffffffee0 =
         GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
         HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                        *)0x2b691f);
  } while (!(bool)in_stack_fffffffffffffee0);
LAB_002b6abf:
  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x2b6acd);
  uVar3 = CONCAT13((char)(in_stack_fffffffffffffecc >> 0x18),
                   CONCAT12(bVar2,(short)in_stack_fffffffffffffecc));
  if (!bVar2) {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::PutEnd
              ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&local_c8,begin);
    bVar2 = SUB81((ulong)in_stack_fffffffffffffed0 >> 0x18,0);
    len = (SizeType)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    if ((local_c8.stack_.stackEnd_._7_1_ & 1) == 0) {
      bVar2 = VWReaderHandler<false>::String
                        ((VWReaderHandler<false> *)
                         CONCAT44(in_stack_fffffffffffffee4,
                                  CONCAT13(in_stack_fffffffffffffee3,
                                           CONCAT12(in_stack_fffffffffffffee2,
                                                    CONCAT11(in_stack_fffffffffffffee1,
                                                             in_stack_fffffffffffffee0)))),
                         (char *)CONCAT17(in_stack_fffffffffffffedf,
                                          CONCAT16(in_stack_fffffffffffffede,
                                                   in_stack_fffffffffffffed8)),len,bVar2);
      code = CONCAT31((int3)((uint)uVar3 >> 8),bVar2);
    }
    else {
      bVar2 = VWReaderHandler<false>::Key
                        ((VWReaderHandler<false> *)
                         CONCAT44(in_stack_fffffffffffffee4,
                                  CONCAT13(in_stack_fffffffffffffee3,
                                           CONCAT12(in_stack_fffffffffffffee2,
                                                    CONCAT11(in_stack_fffffffffffffee1,
                                                             in_stack_fffffffffffffee0)))),
                         (char *)CONCAT17(in_stack_fffffffffffffedf,
                                          CONCAT16(in_stack_fffffffffffffede,
                                                   in_stack_fffffffffffffed8)),len,bVar2);
      code = CONCAT31(CONCAT21((short)((uint)uVar3 >> 0x10),bVar2),bVar2);
    }
    if ((((byte)code ^ 0xff) & 1) != 0) {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell
                ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&local_c8);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError(in_stack_fffffffffffffed0,code,0x2b6bc5);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x2b6bd3);
    }
  }
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy((StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
                    *)&local_c8);
  return;
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false)
  { internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    RAPIDJSON_ASSERT(s.Peek() == '\"');
    s.Take();  // Skip '\"'

    bool success = false;
    if (parseFlags & kParseInsituFlag)
    { typename InputStream::Ch *head = s.PutBegin();
      ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      size_t length = s.PutEnd(head) - 1;
      RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
      const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
      success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
    }
    else
    { StackStream<typename TargetEncoding::Ch> stackStream(stack_);
      ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
      const typename TargetEncoding::Ch* const str = stackStream.Pop();
      success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
    }
    if (RAPIDJSON_UNLIKELY(!success))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
  }